

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

string_t __thiscall
duckdb::MD5Operator::Operation<duckdb::string_t,duckdb::string_t>
          (MD5Operator *this,string_t input,Vector *result)

{
  char *out_digest;
  anon_union_16_2_67f50693_for_value aVar1;
  string_t string;
  string_t hash;
  MD5Context context;
  
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,(Vector *)0x20,(idx_t)input.value._8_8_);
  hash.value = (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer
  ;
  MD5Context::MD5Context(&context);
  string.value.pointer.ptr = (char *)input.value._0_8_;
  string.value._0_8_ = this;
  MD5Context::Add(&context,string);
  out_digest = aVar1.pointer.ptr;
  if (aVar1.pointer.length < 0xd) {
    out_digest = hash.value.pointer.prefix;
  }
  MD5Context::FinishHex(&context,out_digest);
  string_t::Finalize(&hash);
  return (string_t)hash.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto hash = StringVector::EmptyString(result, MD5Context::MD5_HASH_LENGTH_TEXT);
		MD5Context context;
		context.Add(input);
		context.FinishHex(hash.GetDataWriteable());
		hash.Finalize();
		return hash;
	}